

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

ParseResult * __thiscall
cxxopts::OptionParser::parse
          (ParseResult *__return_storage_ptr__,OptionParser *this,int argc,char **argv)

{
  _Hash_node_base *p_Var1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  const_iterator cVar6;
  pointer psVar7;
  mapped_type *pmVar8;
  long lVar9;
  size_type sVar10;
  char *pcVar11;
  sub_match<const_char_*> *psVar12;
  sub_match<const_char_*> *psVar13;
  __node_base *p_Var14;
  int current;
  int local_10c;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> result;
  string local_e0;
  PositionalListIterator next_positional;
  shared_ptr<cxxopts::OptionDetails> value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unmatched;
  shared_ptr<cxxopts::OptionDetails> opt;
  string name;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_48;
  
  current = 1;
  next_positional._M_current =
       (this->m_positional->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_10c = argc;
  while (iVar4 = current, current != local_10c) {
    pcVar11 = argv[current];
    if (((*pcVar11 == '-') && (pcVar11[1] == '-')) && (pcVar11[2] == '\0')) {
      current = current + 1;
      break;
    }
    result.
    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    result._M_begin = (char *)0x0;
    result.
    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    result.
    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
              (pcVar11,&result,
               (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               (anonymous_namespace)::option_matcher_abi_cxx11_,0);
    uVar5 = ((long)result.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)result.
                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    if (uVar5 < 4) {
      pcVar11 = argv[current];
      if (((*pcVar11 == '-') && (pcVar11[1] != '\0')) && (this->m_allow_unrecognised == false)) {
        std::__cxx11::string::string((string *)&local_e0,pcVar11,(allocator *)&name);
        throw_or_mimic<cxxopts::option_syntax_exception>(&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        pcVar11 = argv[current];
      }
      std::__cxx11::string::string((string *)&local_e0,pcVar11,(allocator *)&name);
      bVar2 = consume_positional(this,&local_e0,&next_positional);
      std::__cxx11::string::~string((string *)&local_e0);
      if (!bVar2) {
        std::__cxx11::string::string((string *)&local_e0,argv[current],(allocator *)&name);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&unmatched,
                   &local_e0);
LAB_001477af:
        std::__cxx11::string::~string((string *)&local_e0);
      }
LAB_001477b4:
      current = current + 1;
    }
    else {
      psVar13 = (sub_match<const_char_*> *)
                ((long)result.
                       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                ((long)result.
                       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)result.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) + -0x48);
      psVar12 = result.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 4;
      if (0xfffffffffffffffa < uVar5 - 8) {
        psVar12 = psVar13;
      }
      if (result.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          result.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        psVar12 = psVar13;
      }
      if ((psVar12->matched == true) &&
         ((psVar12->super_pair<const_char_*,_const_char_*>).second !=
          (psVar12->super_pair<const_char_*,_const_char_*>).first)) {
        std::__cxx11::sub_match<const_char_*>::str(&local_e0,psVar12);
        for (sVar10 = 0; sVar10 != local_e0._M_string_length; sVar10 = sVar10 + 1) {
          name._M_dataplus._M_p = (pointer)&name.field_2;
          std::__cxx11::string::_M_construct((ulong)&name,'\x01');
          cVar6 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&this->m_options->_M_h,&name);
          if (cVar6.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            if (this->m_allow_unrecognised != true) {
              throw_or_mimic<cxxopts::option_not_exists_exception>(&name);
              goto LAB_0014759b;
            }
          }
          else {
LAB_0014759b:
            std::__shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                       ,(__shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2> *)
                        ((long)cVar6.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                               ._M_cur + 0x28));
            if (sVar10 + 1 == local_e0._M_string_length) {
              checked_parse_arg(this,local_10c,argv,&current,
                                (shared_ptr<cxxopts::OptionDetails> *)
                                &value.
                                 super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                ,&name);
            }
            else {
              iVar4 = (*(((value.
                           super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->m_value).
                         super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        )->_vptr_Value[7])();
              if ((char)iVar4 == '\0') {
                throw_or_mimic<cxxopts::option_requires_argument_exception>(&name);
              }
              else {
                (*(((value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_value).
                   super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_Value[9])((string *)&opt);
                parse_option(this,(shared_ptr<cxxopts::OptionDetails> *)
                                  &value.
                                   super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                             ,&name,(string *)&opt);
                std::__cxx11::string::~string((string *)&opt);
              }
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
          }
          std::__cxx11::string::~string((string *)&name);
        }
        goto LAB_001477af;
      }
      psVar12 = result.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1;
      if (0xfffffffffffffffd < uVar5 - 5) {
        psVar12 = psVar13;
      }
      if (result.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          result.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        psVar12 = psVar13;
      }
      if ((psVar12->matched != true) ||
         ((psVar12->super_pair<const_char_*,_const_char_*>).second ==
          (psVar12->super_pair<const_char_*,_const_char_*>).first)) goto LAB_001477b4;
      std::__cxx11::sub_match<const_char_*>::str(&local_e0,psVar12);
      cVar6 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&this->m_options->_M_h,&local_e0);
      if (cVar6.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
          ._M_cur != (__node_type *)0x0) {
LAB_001476d8:
        std::__shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&opt.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2> *)
                   ((long)cVar6.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                          ._M_cur + 0x28));
        lVar9 = (long)result.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)result.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        if ((lVar9 == 0) || (0xfffffffffffffffc < lVar9 / 0x18 - 6U)) {
          psVar7 = (pointer)((long)result.
                                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar9 + -0x48);
        }
        else {
          psVar7 = result.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2;
        }
        if ((psVar7->matched == true) &&
           ((psVar7->super_pair<const_char_*,_const_char_*>).second !=
            (psVar7->super_pair<const_char_*,_const_char_*>).first)) {
          if ((result.
               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               result.
               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) ||
             (0xfffffffffffffffb < lVar9 / 0x18 - 7U)) {
            psVar13 = (sub_match<const_char_*> *)
                      ((long)result.
                             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar9 + -0x48);
          }
          else {
            psVar13 = result.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 3;
          }
          std::__cxx11::sub_match<const_char_*>::str(&name,psVar13);
          parse_option(this,&opt,&local_e0,&name);
          std::__cxx11::string::~string((string *)&name);
        }
        else {
          checked_parse_arg(this,local_10c,argv,&current,&opt,&local_e0);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&opt.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        goto LAB_001477af;
      }
      if (this->m_allow_unrecognised != true) {
        throw_or_mimic<cxxopts::option_not_exists_exception>(&local_e0);
        goto LAB_001476d8;
      }
      std::__cxx11::string::string((string *)&name,argv[current],(allocator *)&opt);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&unmatched,
                 &name);
      std::__cxx11::string::~string((string *)&name);
      current = current + 1;
      std::__cxx11::string::~string((string *)&local_e0);
    }
    std::
    _Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     *)&result);
  }
  p_Var14 = &(this->m_options->_M_h)._M_before_begin;
  while (p_Var14 = p_Var14->_M_nxt, p_Var14 != (__node_base *)0x0) {
    p_Var1 = p_Var14[5]._M_nxt[0xc]._M_nxt;
    result.
    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var14[5]._M_nxt[0xf]._M_nxt;
    pmVar8 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->m_parsed,(key_type *)&result);
    bVar3 = (*(code *)p_Var1->_M_nxt[5]._M_nxt)(p_Var1);
    if (((bVar3 & pmVar8->m_count == 0) == 1) && (pmVar8->m_default == false)) {
      parse_default(this,(shared_ptr<cxxopts::OptionDetails> *)(p_Var14 + 5));
    }
  }
  if (iVar4 != local_10c) {
    for (; current < local_10c; current = current + 1) {
      std::__cxx11::string::string((string *)&result,argv[current],(allocator *)&local_e0);
      bVar2 = consume_positional(this,(string *)&result,&next_positional);
      std::__cxx11::string::~string((string *)&result);
      if (!bVar2) break;
    }
    for (; current != local_10c; current = current + 1) {
      std::__cxx11::string::string((string *)&result,argv[current],(allocator *)&local_e0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&unmatched,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result);
      std::__cxx11::string::~string((string *)&result);
    }
  }
  finalise_aliases(this);
  local_48.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->m_sequential).
       super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (this->m_sequential).
       super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this->m_sequential).
       super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->m_sequential).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_sequential).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_sequential).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParseResult::ParseResult
            (__return_storage_ptr__,&this->m_keys,&this->m_parsed,&local_48,&unmatched);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unmatched);
  return __return_storage_ptr__;
}

Assistant:

inline ParseResult
OptionParser::parse(int argc, const char** argv)
{
  int current = 1;
  bool consume_remaining = false;
  PositionalListIterator next_positional = m_positional.begin();

  std::vector<std::string> unmatched;

  while (current != argc)
  {
    if (strcmp(argv[current], "--") == 0)
    {
      consume_remaining = true;
      ++current;
      break;
    }

    std::match_results<const char*> result;
    std::regex_match(argv[current], result, option_matcher);

    if (result.empty())
    {
      //not a flag

      // but if it starts with a `-`, then it's an error
      if (argv[current][0] == '-' && argv[current][1] != '\0') {
        if (!m_allow_unrecognised) {
          throw_or_mimic<option_syntax_exception>(argv[current]);
        }
      }

      //if true is returned here then it was consumed, otherwise it is
      //ignored
      if (consume_positional(argv[current], next_positional))
      {
      }
      else
      {
        unmatched.push_back(argv[current]);
      }
      //if we return from here then it was parsed successfully, so continue
    }
    else
    {
      //short or long option?
      if (result[4].length() != 0)
      {
        const std::string& s = result[4];

        for (std::size_t i = 0; i != s.size(); ++i)
        {
          std::string name(1, s[i]);
          auto iter = m_options.find(name);

          if (iter == m_options.end())
          {
            if (m_allow_unrecognised)
            {
              continue;
            }
            //error
            throw_or_mimic<option_not_exists_exception>(name);
          }

          auto value = iter->second;

          if (i + 1 == s.size())
          {
            //it must be the last argument
            checked_parse_arg(argc, argv, current, value, name);
          }
          else if (value->value().has_implicit())
          {
            parse_option(value, name, value->value().get_implicit_value());
          }
          else
          {
            //error
            throw_or_mimic<option_requires_argument_exception>(name);
          }
        }
      }
      else if (result[1].length() != 0)
      {
        const std::string& name = result[1];

        auto iter = m_options.find(name);

        if (iter == m_options.end())
        {
          if (m_allow_unrecognised)
          {
            // keep unrecognised options in argument list, skip to next argument
            unmatched.push_back(argv[current]);
            ++current;
            continue;
          }
          //error
          throw_or_mimic<option_not_exists_exception>(name);
        }

        auto opt = iter->second;

        //equals provided for long option?
        if (result[2].length() != 0)
        {
          //parse the option given

          parse_option(opt, name, result[3]);
        }
        else
        {
          //parse the next argument
          checked_parse_arg(argc, argv, current, opt, name);
        }
      }

    }

    ++current;
  }

  for (auto& opt : m_options)
  {
    auto& detail = opt.second;
    const auto& value = detail->value();

    auto& store = m_parsed[detail->hash()];

    if(value.has_default() && !store.count() && !store.has_default()){
      parse_default(detail);
    }
  }

  if (consume_remaining)
  {
    while (current < argc)
    {
      if (!consume_positional(argv[current], next_positional)) {
        break;
      }
      ++current;
    }

    //adjust argv for any that couldn't be swallowed
    while (current != argc) {
      unmatched.push_back(argv[current]);
      ++current;
    }
  }

  finalise_aliases();

  ParseResult parsed(std::move(m_keys), std::move(m_parsed), std::move(m_sequential), std::move(unmatched));
  return parsed;
}